

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::createFormatTests(TestCaseGroup *testGroup)

{
  TestContext *pTVar1;
  char *__s;
  TestNode *pTVar2;
  VkFormat value;
  string caseName;
  allocator<char> local_91;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  value = VK_FORMAT_R4G4_UNORM_PACK8;
  do {
    __s = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_91);
    std::__cxx11::string::substr((ulong)&local_90,(ulong)local_50);
    de::toLower(&local_70,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,__s,(allocator<char> *)local_50);
    pTVar2 = (TestNode *)
             createFunctionCase<vk::VkFormat>
                       ((testGroup->super_TestNode).m_testCtx,NODETYPE_SELF_VALIDATE,&local_70,
                        &local_90,formatProperties,value);
    tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    value = value + VK_FORMAT_R4G4_UNORM_PACK8;
  } while (value != (VK_FORMAT_ASTC_12x12_SRGB_BLOCK|VK_FORMAT_R4G4_UNORM_PACK8));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"depth_stencil","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,local_70._M_dataplus._M_p,
             local_90._M_dataplus._M_p);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar2[1].m_testCtx = (TestContext *)testDepthStencilSupported;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"compressed_formats","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  pTVar1 = (testGroup->super_TestNode).m_testCtx;
  pTVar2 = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pTVar1,NODETYPE_SELF_VALIDATE,local_70._M_dataplus._M_p,
             local_90._M_dataplus._M_p);
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20660;
  pTVar2[1].m_testCtx = (TestContext *)testCompressedFormatsSupported;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createFormatTests (tcu::TestCaseGroup* testGroup)
{
	DE_STATIC_ASSERT(VK_FORMAT_UNDEFINED == 0);

	for (deUint32 formatNdx = VK_FORMAT_UNDEFINED+1; formatNdx < VK_CORE_FORMAT_LAST; ++formatNdx)
	{
		const VkFormat		format			= (VkFormat)formatNdx;
		const char* const	enumName		= getFormatName(format);
		const string		caseName		= de::toLower(string(enumName).substr(10));

		addFunctionCase(testGroup, caseName, enumName, formatProperties, format);
	}

	addFunctionCase(testGroup, "depth_stencil",			"",	testDepthStencilSupported);
	addFunctionCase(testGroup, "compressed_formats",	"",	testCompressedFormatsSupported);
}